

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color_maps.h
# Opt level: O2

vec3 __thiscall polyscope::render::ValueColorMap::getValue(ValueColorMap *this,double val)

{
  pointer pvVar1;
  double dVar2;
  undefined1 auVar3 [16];
  int iVar4;
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar7 [64];
  undefined1 in_ZMM2 [64];
  vec<3,_float,_(glm::qualifier)0> vVar8;
  vec<3,_float,_(glm::qualifier)0> vVar9;
  vec3 vVar10;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_28;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aStack_24;
  
  auVar7._8_56_ = in_register_00001208;
  auVar7._0_8_ = val;
  if (0x7fefffffffffffff < (ulong)ABS(val)) {
    return (vec3)(ZEXT412(0) << 0x40);
  }
  pvVar1 = (this->values).
           super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  auVar6 = vmaxsd_avx(ZEXT816(0) << 0x40,auVar7._0_16_);
  auVar6 = vminsd_avx(ZEXT816(0x3ff0000000000000),auVar6);
  lVar5 = ((long)(this->values).
                 super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1) / 0xc + -1;
  auVar3 = vcvtusi2sd_avx512f(in_ZMM2._0_16_,lVar5);
  dVar2 = auVar6._0_8_ * auVar3._0_8_;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = dVar2;
  auVar6 = vroundsd_avx(auVar6,auVar6,9);
  dVar2 = dVar2 - auVar6._0_8_;
  iVar4 = vcvttsd2usi_avx512f(auVar6);
  vVar8 = glm::operator*((float)(1.0 - dVar2),pvVar1 + CONCAT44((int)((ulong)lVar5 >> 0x20),iVar4));
  vVar9 = glm::operator*((float)dVar2,
                         (this->values).
                         super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + (iVar4 + 1));
  local_28 = vVar8.field_0;
  aStack_24 = vVar8.field_1;
  vVar10.field_0 = vVar9.field_0.x + local_28.x;
  vVar10.field_1 = vVar9.field_1.y + aStack_24.y;
  vVar10.field_2.z = vVar9.field_2.z + vVar8.field_2.z;
  return vVar10;
}

Assistant:

glm::vec3 getValue(double val) const {
    if (!std::isfinite(val)) {
      return {0, 0, 0};
    }

    val = glm::clamp(val, 0.0, 1.0);

    // Find the two nearest indices in to the colormap lookup table, then
    // return a linear blend between them.
    double scaledVal = val * (values.size() - 1);
    double lowerVal = std::floor(scaledVal);
    double upperBlendVal = scaledVal - lowerVal;
    unsigned int lowerInd = static_cast<unsigned int>(lowerVal);
    unsigned int upperInd = lowerInd + 1;

    return (float)(1.0 - upperBlendVal) * values[lowerInd] + (float)upperBlendVal * values[upperInd];
  }